

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

quat quat_create_from_axis_angle(vec3 axis,float angle)

{
  float fVar1;
  float w_00;
  vec3 vVar2;
  quat qVar3;
  float w;
  float z;
  float y;
  float x;
  float temp;
  undefined4 local_60;
  float angle_local;
  undefined4 local_28;
  undefined4 uStack_24;
  vec3 axis_local;
  
  vVar2 = vec3_normalize(axis);
  local_60 = vVar2.z;
  fVar1 = sinf(angle * 0.5);
  local_28 = vVar2.x;
  uStack_24 = vVar2.y;
  w_00 = cosf(angle * 0.5);
  qVar3 = quat_create(fVar1 * local_28,fVar1 * uStack_24,fVar1 * local_60,w_00);
  return qVar3;
}

Assistant:

quat quat_create_from_axis_angle(vec3 axis, float angle) {
    axis = vec3_normalize(axis);
    float temp = sinf(angle / 2.0f);
    float x = temp * axis.x;
    float y = temp * axis.y;
    float z = temp * axis.z;
    float w = cosf(angle / 2.0f);
    return quat_create(x, y, z, w);
}